

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::php::anon_unknown_0::PhpGeneratorTest_RequiredFieldError_Test::TestBody
          (PhpGeneratorTest_RequiredFieldError_Test *this)

{
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  PhpGeneratorTest_RequiredFieldError_Test *local_10;
  PhpGeneratorTest_RequiredFieldError_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n    syntax = \"proto2\";\n    message FooBar {\n      required int32 foo_message = 1;\n    }"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");
  CommandLineInterfaceTester::RunProtoc((CommandLineInterfaceTester *)this,local_40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"Can\'t generate PHP code for required field FooBar.foo_message");
  CommandLineInterfaceTester::ExpectErrorSubstring((CommandLineInterfaceTester *)this,local_50);
  return;
}

Assistant:

TEST_F(PhpGeneratorTest, RequiredFieldError) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto2";
    message FooBar {
      required int32 foo_message = 1;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");

  ExpectErrorSubstring(
      "Can't generate PHP code for required field FooBar.foo_message");
}